

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::operator/(Matrix *this,FLOAT *s)

{
  FLOAT FVar1;
  FLOAT **ppFVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  double *in_RDX;
  ulong uVar6;
  int32_t j;
  ulong uVar7;
  Matrix MVar8;
  
  if (1e-20 <= ABS(*in_RDX)) {
    Matrix(this,*(int32_t *)(s + 1),*(int32_t *)((long)s + 0xc));
    uVar5 = 0;
    uVar3 = (ulong)*(uint *)((long)s + 0xc);
    if ((int)*(uint *)((long)s + 0xc) < 1) {
      uVar3 = uVar5;
    }
    uVar6 = (ulong)*(uint *)(s + 1);
    if ((int)*(uint *)(s + 1) < 1) {
      uVar6 = uVar5;
    }
    for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
      FVar1 = *s;
      ppFVar2 = this->val;
      for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
        ppFVar2[uVar5][uVar7] =
             *(double *)(*(long *)((long)FVar1 + uVar5 * 8) + uVar7 * 8) / *in_RDX;
      }
    }
    MVar8.m = (int)uVar6;
    MVar8.n = (int)(uVar6 >> 0x20);
    MVar8.val = (FLOAT **)this;
    return MVar8;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ERROR: Trying to divide by zero!");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(0);
}

Assistant:

Matrix Matrix::operator/ (const FLOAT &s) {
  if (fabs(s)<1e-20) {
    cerr << "ERROR: Trying to divide by zero!" << endl;
    exit(0);
  }
  Matrix C(m,n);
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      C.val[i][j] = val[i][j]/s;
  return C;
}